

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MethodOptions::ByteSizeLong(MethodOptions *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  MethodOptions_IdempotencyLevel value;
  reference value_00;
  uint32_t *puVar4;
  size_t sVar5;
  UninterpretedOption *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  MethodOptions *this_local;
  
  sStack_18 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar3 = _internal_uninterpreted_option_size(this);
  sStack_18 = (long)iVar3 * 2 + sStack_18;
  __end2 = RepeatedPtrField<google::protobuf::UninterpretedOption>::begin
                     (&this->uninterpreted_option_);
  msg = (UninterpretedOption *)
        RepeatedPtrField<google::protobuf::UninterpretedOption>::end(&this->uninterpreted_option_);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::
                 operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_00 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                         (&__end2);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>(value_00);
    sStack_18 = sVar5 + sStack_18;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++(&__end2);
  }
  puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sStack_18 = sStack_18 + 3;
    }
    if ((uVar1 & 2) != 0) {
      value = _internal_idempotency_level(this);
      sVar5 = internal::WireFormatLite::EnumSize(value);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t MethodOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional bool deprecated = 33 [default = false];
    if (cached_has_bits & 0x00000001u) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
    if (cached_has_bits & 0x00000002u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_idempotency_level());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}